

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::TType(TType *this,TPublicType *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TTypeList *pTVar4;
  undefined4 extraout_var;
  char *s;
  TString *pTVar5;
  int dimSize;
  int numBits;
  TPublicType *p_local;
  TType *this_local;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_013a9620;
  *(TBasicType *)&this->field_0x8 =
       *(TBasicType *)&this->field_0x8 & 0xffffff00 | p->basicType & 0xff;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xfffff0ff | (uint)(*(ushort *)&p->field_0xb8 & 0xf) << 8;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xffff0fff | (uint)(*(ushort *)&p->field_0xb8 >> 4 & 0xf) << 0xc;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xfff0ffff | (uint)(*(ushort *)&p->field_0xb8 >> 8 & 0xf) << 0x10
  ;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xffdfffff |
       (uint)((byte)((ushort)*(undefined2 *)&p->field_0xb8 >> 0xc) & 1) << 0x15;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xffbfffff |
       (uint)((byte)((ushort)*(undefined2 *)&p->field_0xb8 >> 0xd) & 1) << 0x16;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff;
  *(uint *)&this->field_0x8 =
       *(uint *)&this->field_0x8 & 0xf7ffffff |
       (uint)((byte)((ushort)*(undefined2 *)&p->field_0xb8 >> 0xe) & 1) << 0x1b;
  this->arraySizes = p->arraySizes;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->typeParameters = p->typeParameters;
  this->spirvType = p->spirvType;
  if ((*(uint *)&this->field_0x8 & 0xff) == 0xe) {
    this->sampler = p->sampler;
  }
  else {
    TSampler::clear(&this->sampler);
  }
  memcpy(&this->qualifier,&p->qualifier,0x50);
  if (p->userDef != (TType *)0x0) {
    if ((*(uint *)&p->userDef->field_0x8 & 0xff) == 0x12) {
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 0x12;
      this->field_13 = p->userDef->field_13;
    }
    else {
      pTVar4 = getWritableStruct(p->userDef);
      (this->field_13).structure = pTVar4;
    }
    iVar2 = (*p->userDef->_vptr_TType[5])();
    s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              CONCAT44(extraout_var,iVar2));
    pTVar5 = NewPoolTString_abi_cxx11_(s);
    this->typeName = pTVar5;
  }
  bVar1 = TPublicType::isCoopmatNV(p);
  if (((bVar1) && (p->typeParameters != (TTypeParameters *)0x0)) &&
     (iVar2 = TArraySizes::getNumDims(p->typeParameters->arraySizes), 0 < iVar2)) {
    iVar2 = TArraySizes::getDimSize(p->typeParameters->arraySizes,0);
    if ((p->basicType == EbtFloat) && (iVar2 == 0x10)) {
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 3;
      *(ulong *)&(this->qualifier).field_0x8 =
           *(ulong *)&(this->qualifier).field_0x8 & 0xfffffffff1ffffff;
    }
    else if ((p->basicType == EbtUint) && (iVar2 == 8)) {
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 5;
      *(ulong *)&(this->qualifier).field_0x8 =
           *(ulong *)&(this->qualifier).field_0x8 & 0xfffffffff1ffffff;
    }
    else if ((p->basicType == EbtUint) && (iVar2 == 0x10)) {
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 7;
      *(ulong *)&(this->qualifier).field_0x8 =
           *(ulong *)&(this->qualifier).field_0x8 & 0xfffffffff1ffffff;
    }
    else if ((p->basicType == EbtInt) && (iVar2 == 8)) {
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 4;
      *(ulong *)&(this->qualifier).field_0x8 =
           *(ulong *)&(this->qualifier).field_0x8 & 0xfffffffff1ffffff;
    }
    else if ((p->basicType == EbtInt) && (iVar2 == 0x10)) {
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 6;
      *(ulong *)&(this->qualifier).field_0x8 =
           *(ulong *)&(this->qualifier).field_0x8 & 0xfffffffff1ffffff;
    }
  }
  bVar1 = TPublicType::isCoopmatKHR(p);
  if (((bVar1) && (p->typeParameters != (TTypeParameters *)0x0)) &&
     (iVar2 = TArraySizes::getNumDims(p->typeParameters->arraySizes), 0 < iVar2)) {
    *(TBasicType *)&this->field_0x8 =
         *(TBasicType *)&this->field_0x8 & 0xffffff00 | p->typeParameters->basicType & 0xff;
    bVar1 = isSpirvType(this);
    if (bVar1) {
      if (p->typeParameters->spirvType == (TSpirvType *)0x0) {
        __assert_fail("p.typeParameters->spirvType",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x65d,"glslang::TType::TType(const TPublicType &)");
      }
      this->spirvType = p->typeParameters->spirvType;
    }
    iVar2 = TArraySizes::getNumDims(p->typeParameters->arraySizes);
    if (iVar2 == 4) {
      uVar3 = TArraySizes::getDimSize(p->typeParameters->arraySizes,3);
      if ((int)uVar3 < 0) {
        __assert_fail("dimSize >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x663,"glslang::TType::TType(const TPublicType &)");
      }
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff | (uVar3 & 7) << 0x17;
      *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff | 0x4000000;
    }
  }
  bVar1 = TPublicType::isCoopvecNV(p);
  if ((bVar1) && (p->typeParameters != (TTypeParameters *)0x0)) {
    *(TBasicType *)&this->field_0x8 =
         *(TBasicType *)&this->field_0x8 & 0xffffff00 | p->typeParameters->basicType & 0xff;
  }
  return;
}

Assistant:

explicit TType(const TPublicType& p) :
                            basicType(p.basicType),
                            vectorSize(p.vectorSize), matrixCols(p.matrixCols), matrixRows(p.matrixRows), vector1(false), coopmatNV(p.coopmatNV), coopmatKHR(p.coopmatKHR), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(p.coopvecNV),
                            arraySizes(p.arraySizes), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(p.typeParameters),
                            spirvType(p.spirvType)
                            {
                                if (basicType == EbtSampler)
                                    sampler = p.sampler;
                                else
                                    sampler.clear();
                                qualifier = p.qualifier;
                                if (p.userDef) {
                                    if (p.userDef->basicType == EbtReference) {
                                        basicType = EbtReference;
                                        referentType = p.userDef->referentType;
                                    } else {
                                        structure = p.userDef->getWritableStruct();  // public type is short-lived; there are no sharing issues
                                    }
                                    typeName = NewPoolTString(p.userDef->getTypeName().c_str());
                                }
                                if (p.isCoopmatNV() && p.typeParameters && p.typeParameters->arraySizes->getNumDims() > 0) {
                                    int numBits = p.typeParameters->arraySizes->getDimSize(0);
                                    if (p.basicType == EbtFloat && numBits == 16) {
                                        basicType = EbtFloat16;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtUint && numBits == 8) {
                                        basicType = EbtUint8;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtUint && numBits == 16) {
                                        basicType = EbtUint16;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtInt && numBits == 8) {
                                        basicType = EbtInt8;
                                        qualifier.precision = EpqNone;
                                    } else if (p.basicType == EbtInt && numBits == 16) {
                                        basicType = EbtInt16;
                                        qualifier.precision = EpqNone;
                                    }
                                }
                                if (p.isCoopmatKHR() && p.typeParameters && p.typeParameters->arraySizes->getNumDims() > 0) {
                                    basicType = p.typeParameters->basicType;
                                    if (isSpirvType()) {
                                        assert(p.typeParameters->spirvType);
                                        spirvType = p.typeParameters->spirvType;
                                    }

                                    if (p.typeParameters->arraySizes->getNumDims() == 4) {
                                        const int dimSize = p.typeParameters->arraySizes->getDimSize(3);
                                        assert(dimSize >= 0);
                                        coopmatKHRuse = static_cast<uint32_t>(dimSize) & 0b111;
                                        coopmatKHRUseValid = true;
                                    }
                                }
                                if (p.isCoopvecNV() && p.typeParameters) {
                                    basicType = p.typeParameters->basicType;
                                }
                            }